

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmTargetTraceDependencies::QueueSource(cmTargetTraceDependencies *this,cmSourceFile *sf)

{
  string *__x;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar1;
  cmSourceFile *local_18;
  
  local_18 = sf;
  pVar1 = std::
          _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
          ::_M_insert_unique<cmSourceFile*const&>
                    ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                      *)&this->SourcesQueued,&local_18);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::deque<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
              (&(this->SourceQueue).c,&local_18);
    __x = cmSourceFile::GetFullPath(local_18,(string *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->NewSources,__x);
  }
  return;
}

Assistant:

void cmTargetTraceDependencies::QueueSource(cmSourceFile* sf)
{
  if (this->SourcesQueued.insert(sf).second) {
    this->SourceQueue.push(sf);

    // Make sure this file is in the target at the end.
    this->NewSources.push_back(sf->GetFullPath());
  }
}